

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescue.c
# Opt level: O2

int path_join(char *root,char *path,char **out)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = strlen(root);
  __dest = (char *)malloc(sVar1 * 2 + 2);
  *out = __dest;
  if (root[sVar1 - 1] == '/') {
    strcpy(__dest,root);
    __dest = __dest + sVar1;
  }
  else if (*path != '/') {
    strcpy(__dest,root);
    __dest[sVar1] = '/';
    __dest = __dest + sVar1 + 1;
  }
  strcpy(__dest,path);
  return 1;
}

Assistant:

int path_join(const char* root, const char* path, char** out) {

    size_t rlen = strlen(root);
    size_t plen = strlen(root);

    *out = (char*) malloc(sizeof(char) * (rlen + plen + 2));

    if (IS_PATH_DELIMITER(root[rlen - 1]))
    {
        strcpy(*out, root);
        strcpy(&((*out)[rlen]), path);
    } else if (IS_PATH_DELIMITER(path[0]))
    {
        strcpy(*out, path);
    }
    else {
        strcpy(*out, root);
        (*out)[rlen] = PATH_DELIMITER;
        strcpy(&((*out)[rlen + 1]), path);
    }

    return 1;

}